

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_int64 localtimeOffset(DateTime *p,sqlite3_context *pCtx,int *pRc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  sqlite3_int64 sVar4;
  sqlite3_mutex *psVar5;
  tm *ptVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined8 uVar11;
  double dVar12;
  time_t t;
  DateTime local_b8;
  int local_88;
  int iStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  DateTime local_60;
  
  local_b8.iJD = p->iJD;
  local_b8.Y = p->Y;
  local_b8.M = p->M;
  local_b8.D = p->D;
  local_b8.h = p->h;
  local_b8.m = p->m;
  local_b8.tz = p->tz;
  local_b8.s = p->s;
  local_b8.validJD = p->validJD;
  local_b8.rawS = p->rawS;
  local_b8.validYMD = p->validYMD;
  local_b8.validHMS = p->validHMS;
  local_b8.validTZ = p->validTZ;
  local_b8.tzSet = p->tzSet;
  local_b8.isError = p->isError;
  local_b8._47_1_ = p->field_0x2f;
  computeYMD_HMS(&local_b8);
  if (local_b8.Y - 0x7f6U < 0xffffffbd) {
    local_b8.Y = 2000;
    local_b8.M = 1;
    local_b8.D = 1;
    local_b8.h = 0;
    local_b8.m = 0;
    local_b8.tz = 0;
    local_b8.s = 0.0;
  }
  else {
    local_b8.s = (double)(int)(local_b8.s + 0.5);
  }
  local_b8._24_8_ = local_b8._24_8_ & 0xffffffff;
  local_b8._40_8_ = local_b8._40_8_ & 0xffffffffffffff00;
  computeJD(&local_b8);
  sVar4 = local_b8.iJD;
  t = local_b8.iJD / 1000 + -0x3118a36940;
  bVar3 = true;
  iVar7 = 0;
  if (sqlite3Config.bCoreMutex != 0) {
    psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar5 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar5);
      bVar3 = false;
      goto LAB_0026e8f2;
    }
  }
  psVar5 = (sqlite3_mutex *)0x0;
LAB_0026e8f2:
  ptVar6 = localtime(&t);
  bVar8 = sqlite3Config.bLocaltimeFault != 0;
  if (ptVar6 == (tm *)0x0 || bVar8) {
    uVar11 = 0;
    iVar9 = 1;
    iVar10 = 0x76c;
    dVar12 = 0.0;
  }
  else {
    iVar7 = ptVar6->tm_min;
    uVar11._0_4_ = ptVar6->tm_hour;
    uVar11._4_4_ = ptVar6->tm_mday;
    uVar1 = ptVar6->tm_mon;
    uVar2 = ptVar6->tm_year;
    iVar9 = uVar1 + 1;
    iVar10 = uVar2 + 0x76c;
    dVar12 = (double)ptVar6->tm_sec;
  }
  if (!bVar3) {
    uStack_70 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_88 = iVar9;
    iStack_84 = iVar10;
    local_78 = uVar11;
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
    uVar11 = local_78;
    iVar9 = local_88;
    iVar10 = iStack_84;
  }
  bVar8 = ptVar6 == (tm *)0x0 || bVar8;
  if (bVar8) {
    sqlite3_result_error(pCtx,"local time unavailable",-1);
    local_60.iJD = 0;
  }
  else {
    local_60.M = iVar9;
    local_60.Y = iVar10;
    local_60.h = (int)uVar11;
    local_60.D = (int)((ulong)uVar11 >> 0x20);
    local_60.validJD = '\0';
    local_60.rawS = '\0';
    local_60.validYMD = '\x01';
    local_60.validHMS = '\x01';
    local_60.validTZ = '\0';
    local_60.isError = '\0';
    local_60.m = iVar7;
    local_60.s = dVar12;
    computeJD(&local_60);
    local_60.iJD = local_60.iJD - sVar4;
  }
  *pRc = (uint)bVar8;
  return local_60.iJD;
}

Assistant:

static sqlite3_int64 localtimeOffset(
  DateTime *p,                    /* Date at which to calculate offset */
  sqlite3_context *pCtx,          /* Write error here if one occurs */
  int *pRc                        /* OUT: Error code. SQLITE_OK or ERROR */
){
  DateTime x, y;
  time_t t;
  struct tm sLocal;

  /* Initialize the contents of sLocal to avoid a compiler warning. */
  memset(&sLocal, 0, sizeof(sLocal));

  x = *p;
  computeYMD_HMS(&x);
  if( x.Y<1971 || x.Y>=2038 ){
    /* EVIDENCE-OF: R-55269-29598 The localtime_r() C function normally only
    ** works for years between 1970 and 2037. For dates outside this range,
    ** SQLite attempts to map the year into an equivalent year within this
    ** range, do the calculation, then map the year back.
    */
    x.Y = 2000;
    x.M = 1;
    x.D = 1;
    x.h = 0;
    x.m = 0;
    x.s = 0.0;
  } else {
    int s = (int)(x.s + 0.5);
    x.s = s;
  }
  x.tz = 0;
  x.validJD = 0;
  computeJD(&x);
  t = (time_t)(x.iJD/1000 - 21086676*(i64)10000);
  if( osLocaltime(&t, &sLocal) ){
    sqlite3_result_error(pCtx, "local time unavailable", -1);
    *pRc = SQLITE_ERROR;
    return 0;
  }
  y.Y = sLocal.tm_year + 1900;
  y.M = sLocal.tm_mon + 1;
  y.D = sLocal.tm_mday;
  y.h = sLocal.tm_hour;
  y.m = sLocal.tm_min;
  y.s = sLocal.tm_sec;
  y.validYMD = 1;
  y.validHMS = 1;
  y.validJD = 0;
  y.rawS = 0;
  y.validTZ = 0;
  y.isError = 0;
  computeJD(&y);
  *pRc = SQLITE_OK;
  return y.iJD - x.iJD;
}